

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::Argument::Argument<2ul,0ul,1ul>(void *param_1,undefined8 param_2)

{
  string_view aName;
  string_view aName_00;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  iterator iVar2;
  iterator iVar3;
  basic_string_view<char,_std::char_traits<char>_> *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  bool local_b9;
  undefined1 local_1a [2];
  undefined8 local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1345b1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)param_1 + 0x18));
  std::__cxx11::string::string((string *)((long)param_1 + 0x28));
  std::any::any((any *)0x1345e5);
  std::any::any((any *)0x1345f8);
  std::
  variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
  ::
  variant<std::function<std::any(std::__cxx11::string_const&)>,argparse::Argument::mAction::_lambda(std::__cxx11::string_const&)_1_,void>
            ((variant<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              *)((long)param_1 + 0x68),local_1a);
  __args = (basic_string_view<char,_std::char_traits<char>_> *)((long)param_1 + 0x90);
  std::vector<std::any,_std::allocator<std::any>_>::vector
            ((vector<std::any,_std::allocator<std::any>_> *)0x13462b);
  *(undefined4 *)((long)param_1 + 0xa8) = 1;
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)param_1 + 0xac);
  aName._M_str = (char *)this;
  aName._M_len = (size_t)__args;
  bVar1 = is_optional(aName);
  local_b9 = true;
  if (!bVar1) {
    aName_00._M_str = (char *)this;
    aName_00._M_len = (size_t)__args;
    local_b9 = is_optional(aName_00);
  }
  *(byte *)&(this->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start =
       *(byte *)&(this->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start & 0xfe | local_b9;
  *(byte *)((long)param_1 + 0xac) = *(byte *)((long)param_1 + 0xac) & 0xfd;
  *(byte *)((long)param_1 + 0xac) = *(byte *)((long)param_1 + 0xac) & 0xfb;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(this,__args);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(this,__args);
  iVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(in_stack_ffffffffffffff38);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(in_stack_ffffffffffffff38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,argparse::Argument::Argument<2ul,0ul,1ul>(std::basic_string_view<char,std::char_traits<char>>(&&)[2ul],std::integer_sequence<unsigned_long,0ul,1ul>)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar2._M_current,iVar3._M_current);
  return;
}

Assistant:

explicit Argument(std::string_view(&&a)[N], std::index_sequence<I...>)
      : mIsOptional((is_optional(a[I]) || ...)), mIsRequired(false),
        mIsUsed(false) {
    ((void)mNames.emplace_back(a[I]), ...);
    std::sort(
        mNames.begin(), mNames.end(), [](const auto &lhs, const auto &rhs) {
          return lhs.size() == rhs.size() ? lhs < rhs : lhs.size() < rhs.size();
        });
  }